

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.hpp
# Opt level: O0

int __thiscall Encode::calcMedian(Encode *this,int left,int right)

{
  double dVar1;
  double dVar2;
  reference pvVar3;
  undefined4 local_44;
  size_type sStack_40;
  int i;
  unsigned_long median;
  longdouble sumRight;
  longdouble sumLeft;
  int right_local;
  int left_local;
  Encode *this_local;
  
  dVar2 = 0.0;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&this->m_probabilities,(long)right);
  dVar1 = *pvVar3;
  for (local_44 = left; local_44 < right; local_44 = local_44 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->m_probabilities,(long)local_44);
    dVar2 = dVar2 + *pvVar3;
  }
  sStack_40 = (size_type)right;
  for (; dVar1 <= dVar2; dVar1 = dVar1 + *pvVar3) {
    sStack_40 = sStack_40 - 1;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->m_probabilities,sStack_40);
    dVar2 = dVar2 - *pvVar3;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->m_probabilities,sStack_40);
  }
  return (int)sStack_40;
}

Assistant:

int calcMedian(int left, int right) {
        long double sumLeft = 0, sumRight = m_probabilities[right];
        unsigned long median;
        for (int i = left; i < right; ++i) {
            sumLeft += m_probabilities[i];
        }
        median = right;
        while (sumLeft >= sumRight) {
            --median;
            sumLeft -= m_probabilities[median];
            sumRight += m_probabilities[median];
        }
        return (int) median;
    }